

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CheckAspectRatio.cpp
# Opt level: O2

int CheckAspectRatio(double smallest_ratio,int x,int y,int z,char *what,bool DoIo)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  double dVar4;
  
  iVar1 = x;
  if (y < x) {
    iVar1 = y;
  }
  if (z <= iVar1) {
    iVar1 = z;
  }
  iVar2 = y;
  if (y < x) {
    iVar2 = x;
  }
  if (iVar2 <= z) {
    iVar2 = z;
  }
  dVar4 = (double)iVar1 / (double)iVar2;
  iVar1 = 0;
  if (dVar4 < smallest_ratio) {
    iVar1 = 0x7f;
  }
  if (dVar4 < smallest_ratio && DoIo) {
    poVar3 = std::operator<<((ostream *)HPCG_fout,"The ");
    poVar3 = std::operator<<(poVar3,what);
    poVar3 = std::operator<<(poVar3," sizes (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,x);
    poVar3 = std::operator<<(poVar3,",");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,y);
    poVar3 = std::operator<<(poVar3,",");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,z);
    std::operator<<(poVar3,") are invalid because the ratio min(x,y,z)/max(x,y,z)=");
    poVar3 = std::ostream::_M_insert<double>(dVar4);
    std::operator<<(poVar3," is too small (at least ");
    poVar3 = std::ostream::_M_insert<double>(smallest_ratio);
    poVar3 = std::operator<<(poVar3," is required).");
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)HPCG_fout,
                             "The shape should resemble a 3D cube. Please adjust and try again.");
    std::endl<char,std::char_traits<char>>(poVar3);
    std::ostream::flush();
    iVar1 = 0x7f;
  }
  return iVar1;
}

Assistant:

int
CheckAspectRatio(double smallest_ratio, int x, int y, int z, const char *what, bool DoIo) {
  double current_ratio = std::min(std::min(x, y), z) / double(std::max(std::max(x, y), z));

  if (current_ratio < smallest_ratio) { // ratio of the smallest to the largest
    if (DoIo) {
      HPCG_fout << "The " << what << " sizes (" << x << "," << y << "," << z <<
        ") are invalid because the ratio min(x,y,z)/max(x,y,z)=" << current_ratio <<
        " is too small (at least " << smallest_ratio << " is required)." << std::endl;
      HPCG_fout << "The shape should resemble a 3D cube. Please adjust and try again." << std::endl;
      HPCG_fout.flush();
    }

#ifndef HPCG_NO_MPI
    MPI_Abort(MPI_COMM_WORLD, 127);
#endif

    return 127;
  }

  return 0;
}